

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O0

int __thiscall ncnn::Padding::forward(Padding *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  float *pfVar5;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float pad_value;
  Mat borderm;
  Mat m;
  int q;
  int outh;
  int outw;
  size_t elemsize;
  int dims;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined2 in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed2;
  int in_stack_fffffffffffffed4;
  float value;
  undefined8 in_stack_fffffffffffffed8;
  int _w;
  Mat *in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  long in_stack_ffffffffffffff00;
  Mat *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 local_4c;
  undefined4 local_4;
  
  if ((((*(int *)(in_RDI + 0xb8) == 0) && (*(int *)(in_RDI + 0xbc) == 0)) &&
      (*(int *)(in_RDI + 0xc0) == 0)) && (*(int *)(in_RDI + 0xc4) == 0)) {
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (Mat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    local_4 = 0;
  }
  else {
    iVar1 = *(int *)(in_RSI + 0x34);
    iVar2 = *(int *)(in_RSI + 0x28);
    lVar3 = *(long *)(in_RSI + 0x10);
    _w = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    if (iVar2 == 1) {
      ncnn::Mat::create(in_stack_fffffffffffffee0,_w,
                        CONCAT44(in_stack_fffffffffffffed4,
                                 CONCAT22(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0)),
                        (Allocator *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      bVar4 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
      ;
      if (bVar4) {
        local_4 = -100;
      }
      else {
        if (lVar3 == 1) {
          copy_make_border_image<signed_char>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     (int)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                     (char)((uint)in_stack_fffffffffffffef8 >> 0x18));
        }
        if (lVar3 == 2) {
          in_stack_ffffffffffffff10 = *(undefined4 *)(in_RDI + 0xc0);
          in_stack_ffffffffffffff14 = *(undefined4 *)(in_RDI + 200);
          float32_to_bfloat16(*(float *)(in_RDI + 0xcc));
          copy_make_border_image<unsigned_short>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_RDX,
                     (int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_stack_fffffffffffffefc,
                     (unsigned_short)((uint)in_stack_fffffffffffffef8 >> 0x10));
          in_stack_ffffffffffffff00 = in_RSI;
          in_stack_ffffffffffffff08 = in_RDX;
        }
        if (lVar3 == 4) {
          copy_make_border_image<float>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     (int)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                     in_stack_fffffffffffffef8);
        }
        local_4 = 0;
      }
    }
    else if (iVar2 == 2) {
      ncnn::Mat::create(in_stack_fffffffffffffee0,_w,(int)in_stack_fffffffffffffed8,
                        CONCAT44(in_stack_fffffffffffffed4,
                                 CONCAT22(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0)),
                        (Allocator *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      bVar4 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
      ;
      if (bVar4) {
        local_4 = -100;
      }
      else {
        if (lVar3 == 1) {
          copy_make_border_image<signed_char>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     (int)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                     (char)((uint)in_stack_fffffffffffffef8 >> 0x18));
        }
        if (lVar3 == 2) {
          in_stack_fffffffffffffef8 = *(float *)(in_RDI + 0xc0);
          in_stack_fffffffffffffefc = *(int *)(in_RDI + 200);
          float32_to_bfloat16(*(float *)(in_RDI + 0xcc));
          copy_make_border_image<unsigned_short>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     (int)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                     (unsigned_short)((uint)in_stack_fffffffffffffef8 >> 0x10));
        }
        if (lVar3 == 4) {
          copy_make_border_image<float>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     (int)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                     in_stack_fffffffffffffef8);
        }
        local_4 = 0;
      }
    }
    else if (iVar2 == 3) {
      ncnn::Mat::create(in_stack_fffffffffffffee0,_w,(int)in_stack_fffffffffffffed8,
                        in_stack_fffffffffffffed4,
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                        (Allocator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      bVar4 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
      ;
      if (bVar4) {
        local_4 = -100;
      }
      else {
        for (local_4c = 0; local_4c < iVar1; local_4c = local_4c + 1) {
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                             in_stack_fffffffffffffec4);
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                             in_stack_fffffffffffffec4);
          if (*(int *)(in_RDI + 0xd0) == 0) {
            value = *(float *)(in_RDI + 0xcc);
          }
          else {
            pfVar5 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),(long)local_4c);
            value = *pfVar5;
          }
          if (lVar3 == 1) {
            copy_make_border_image<signed_char>
                      ((Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                       (int)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                       (char)((uint)in_stack_fffffffffffffef8 >> 0x18));
          }
          if (lVar3 == 2) {
            in_stack_fffffffffffffec4 = *(int *)(in_RDI + 0xb8);
            in_stack_fffffffffffffec8 = *(undefined4 *)(in_RDI + 0xc0);
            in_stack_fffffffffffffecc = *(undefined4 *)(in_RDI + 200);
            float32_to_bfloat16(value);
            copy_make_border_image<unsigned_short>
                      ((Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                       (int)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                       (unsigned_short)((uint)in_stack_fffffffffffffef8 >> 0x10));
          }
          if (lVar3 == 4) {
            copy_make_border_image<float>
                      ((Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                       (int)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                       in_stack_fffffffffffffef8);
          }
          ncnn::Mat::~Mat((Mat *)0x1e73e8);
          ncnn::Mat::~Mat((Mat *)0x1e73f5);
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Padding::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w + left + right;

    if (dims == 1)
    {
        top_blob.create(outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, 0, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, 0, left, type, float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, 0, left, type, value);

        return 0;
    }

    int outh = h + top + bottom;

    if (dims == 2)
    {
        top_blob.create(outw, outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, top, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, top, left, type, float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, top, left, type, value);

        return 0;
    }

    if (dims == 3)
    {
        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob.channel(q);
            Mat borderm = top_blob.channel(q);

            float pad_value = per_channel_pad_data_size ? per_channel_pad_data[q] : value;

            if (elemsize == 1)
                copy_make_border_image<signed char>(m, borderm, top, left, type, static_cast<signed char>(pad_value));
            if (elemsize == 2)
                copy_make_border_image<unsigned short>(m, borderm, top, left, type, float32_to_bfloat16(pad_value));
            if (elemsize == 4)
                copy_make_border_image<float>(m, borderm, top, left, type, pad_value);
        }

        return 0;
    }

    return 0;
}